

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::InstancedRenderingCase::InstancedRenderingCase
          (InstancedRenderingCase *this,Context *context,char *name,char *description,
          DrawFunction function,InstancingType instancingType,DataType rgbAttrType,int numInstances)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InstancedRenderingCase_02189ed8;
  this->m_function = function;
  this->m_instancingType = instancingType;
  this->m_rgbAttrType = rgbAttrType;
  this->m_numInstances = numInstances;
  memset(&this->m_gridVertexPositions,0,0x98);
  return;
}

Assistant:

InstancedRenderingCase::InstancedRenderingCase (Context& context, const char* name, const char* description, DrawFunction function, InstancingType instancingType, glu::DataType rgbAttrType, int numInstances)
	: TestCase			(context, name, description)
	, m_function		(function)
	, m_instancingType	(instancingType)
	, m_rgbAttrType		(rgbAttrType)
	, m_numInstances	(numInstances)
	, m_program			(DE_NULL)
{
}